

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_x86_avx2.cpp
# Opt level: O2

int __thiscall
ncnn::Convolution_x86_avx2::forwardDilation_x86
          (Convolution_x86_avx2 *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  undefined1 auVar1 [32];
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  size_t _elemsize;
  _func_int *p_Var7;
  Layer *pLVar8;
  int iVar9;
  int iVar10;
  ulong uVar11;
  long lVar12;
  ulong uVar13;
  int _c;
  ulong uVar14;
  int iVar15;
  ulong uVar16;
  int _w;
  int iVar17;
  ulong uVar18;
  int iVar19;
  int _w_00;
  ulong uVar20;
  int i;
  ulong uVar21;
  long lVar22;
  void *pvVar23;
  undefined4 *puVar24;
  long lVar25;
  undefined1 auVar26 [16];
  undefined4 *local_228;
  long local_208;
  long local_1d0;
  long local_1a8;
  long local_1a0;
  Mat inner_top_blob;
  Mat inner_bottom_blob;
  Mat local_c0;
  Option opt_g;
  
  iVar2 = bottom_blob->w;
  iVar3 = bottom_blob->h;
  _elemsize = bottom_blob->elemsize;
  p_Var7 = this->_vptr_Convolution_x86_avx2[-3];
  iVar4 = *(int *)(p_Var7 + 0x34 + (long)&(this->weight_data_3x3_winograd63).data);
  iVar5 = *(int *)(p_Var7 + 0x44 + (long)&(this->weight_data_3x3_winograd63).data);
  uVar6 = *(uint *)(p_Var7 + 0x3c + (long)&(this->weight_data_3x3_winograd63).data);
  iVar19 = (iVar4 + -1) * uVar6 + 1;
  iVar9 = (iVar2 - iVar19) / iVar5;
  _w = iVar9 + 1;
  Mat::create(top_blob,_w,(iVar3 - iVar19) / iVar5 + 1,
              *(int *)(p_Var7 + 0x30 + (long)&(this->weight_data_3x3_winograd63).data),_elemsize,
              opt->blob_allocator);
  iVar19 = -100;
  if ((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0)) {
    inner_bottom_blob.cstep = 0;
    auVar26 = ZEXT816(0) << 0x40;
    inner_top_blob.data = (Allocator *)0x0;
    inner_top_blob.refcount._0_4_ = 0;
    inner_top_blob.refcount._4_4_ = 0;
    inner_bottom_blob._16_12_ = auVar26._4_12_;
    inner_top_blob.cstep = 0;
    inner_bottom_blob._32_12_ = auVar26._0_12_;
    inner_bottom_blob._48_8_ = auVar26._4_8_;
    inner_top_blob.c = 0;
    local_1d0 = 0;
    uVar20 = 0;
    if (0 < (int)uVar6) {
      uVar20 = (ulong)uVar6;
    }
    local_208 = 0;
    inner_top_blob._16_12_ = inner_bottom_blob._16_12_;
    inner_top_blob.allocator = (Allocator *)inner_top_blob.data;
    inner_top_blob.dims = (int)inner_top_blob.refcount;
    inner_top_blob.w = inner_top_blob.refcount._4_4_;
    inner_top_blob._48_8_ = inner_bottom_blob._48_8_;
    inner_bottom_blob.data = inner_top_blob.data;
    inner_bottom_blob.refcount._0_4_ = (int)inner_top_blob.refcount;
    inner_bottom_blob.refcount._4_4_ = inner_top_blob.refcount._4_4_;
    inner_bottom_blob.w = inner_top_blob.refcount._4_4_;
    inner_bottom_blob.c = inner_top_blob.c;
    for (uVar13 = 0; uVar13 != uVar20; uVar13 = uVar13 + 1) {
      local_1a8 = local_1d0;
      local_1a0 = local_208;
      for (uVar14 = 0; uVar14 != uVar6; uVar14 = uVar14 + 1) {
        uVar18 = (long)(int)(((uVar6 - 1) + iVar2) - (int)uVar14) / (long)(int)uVar6;
        uVar21 = (long)(int)((uVar6 + iVar3 + -1) - (int)uVar13) / (long)(int)uVar6;
        uVar16 = uVar21 & 0xffffffff;
        iVar17 = (int)uVar18;
        iVar19 = (iVar17 - iVar4) / iVar5;
        iVar15 = (int)uVar21;
        iVar10 = (iVar15 - iVar4) / iVar5;
        Mat::create(&inner_bottom_blob,iVar17,iVar15,bottom_blob->c,_elemsize,
                    opt->workspace_allocator);
        if ((inner_bottom_blob.data == (void *)0x0) ||
           ((long)inner_bottom_blob.c * inner_bottom_blob.cstep == 0)) {
LAB_0018319b:
          iVar19 = -100;
          goto LAB_0018319f;
        }
        _w_00 = iVar19 + 1;
        Mat::create(&inner_top_blob,_w_00,iVar10 + 1,
                    *(int *)(this->_vptr_Convolution_x86_avx2[-3] + 0x30 +
                            (long)&(this->weight_data_3x3_winograd63).data),_elemsize,
                    opt->workspace_allocator);
        if ((inner_top_blob.data == (void *)0x0) ||
           ((long)inner_top_blob.c * inner_top_blob.cstep == 0)) goto LAB_0018319b;
        _c = 0;
        uVar18 = uVar18 & 0xffffffff;
        if (iVar17 < 1) {
          uVar18 = 0;
        }
        if (iVar15 < 1) {
          uVar16 = 0;
        }
        for (; _c < bottom_blob->c; _c = _c + 1) {
          Mat::channel(&local_c0,&inner_bottom_blob,_c);
          pvVar23 = local_c0.data;
          Mat::~Mat(&local_c0);
          iVar15 = 0;
          for (uVar21 = 0; uVar21 != uVar16; uVar21 = uVar21 + 1) {
            Mat::channel(&local_c0,bottom_blob,_c);
            puVar24 = (undefined4 *)((long)local_c0.data + (long)iVar15 * 4 + local_1a0);
            Mat::~Mat(&local_c0);
            for (uVar11 = 0; uVar18 != uVar11; uVar11 = uVar11 + 1) {
              *(undefined4 *)((long)pvVar23 + uVar11 * 4) = *puVar24;
              puVar24 = puVar24 + (int)uVar6;
            }
            pvVar23 = (void *)((long)pvVar23 + (long)iVar17 * 4);
            iVar15 = iVar15 + uVar6 * iVar2;
          }
        }
        auVar1[0] = opt->lightmode;
        auVar1._1_3_ = *(undefined3 *)&opt->field_0x1;
        auVar1._4_4_ = opt->num_threads;
        auVar1._8_8_ = opt->blob_allocator;
        auVar1._16_8_ = opt->workspace_allocator;
        auVar1._24_4_ = opt->openmp_blocktime;
        auVar1[0x1c] = opt->use_winograd_convolution;
        auVar1[0x1d] = opt->use_sgemm_convolution;
        auVar1[0x1e] = opt->use_int8_inference;
        auVar1[0x1f] = opt->use_vulkan_compute;
        opt_g.use_bf16_storage = opt->use_bf16_storage;
        opt_g.use_fp16_packed = opt->use_fp16_packed;
        opt_g.use_fp16_storage = opt->use_fp16_storage;
        opt_g.use_fp16_arithmetic = opt->use_fp16_arithmetic;
        opt_g.use_int8_packed = opt->use_int8_packed;
        opt_g.use_int8_storage = opt->use_int8_storage;
        opt_g.use_int8_arithmetic = opt->use_int8_arithmetic;
        opt_g.use_packing_layout = opt->use_packing_layout;
        opt_g.use_shader_pack8 = opt->use_shader_pack8;
        opt_g.use_subgroup_basic = opt->use_subgroup_basic;
        opt_g.use_subgroup_vote = opt->use_subgroup_vote;
        opt_g.use_subgroup_ballot = opt->use_subgroup_ballot;
        opt_g.use_subgroup_shuffle = opt->use_subgroup_shuffle;
        opt_g.use_image_storage = opt->use_image_storage;
        opt_g.use_tensor_storage = opt->use_tensor_storage;
        opt_g.use_weight_fp16_storage = opt->use_weight_fp16_storage;
        opt_g.flush_denormals = opt->flush_denormals;
        opt_g.use_local_pool_allocator = opt->use_local_pool_allocator;
        opt_g.use_reserved_1 = opt->use_reserved_1;
        opt_g.use_reserved_2 = opt->use_reserved_2;
        opt_g.use_reserved_3 = opt->use_reserved_3;
        opt_g.use_reserved_4 = opt->use_reserved_4;
        opt_g.use_reserved_5 = opt->use_reserved_5;
        opt_g.use_reserved_6 = opt->use_reserved_6;
        opt_g.use_reserved_7 = opt->use_reserved_7;
        opt_g.use_reserved_8 = opt->use_reserved_8;
        opt_g.use_reserved_9 = opt->use_reserved_9;
        opt_g.use_reserved_10 = opt->use_reserved_10;
        opt_g.use_reserved_11 = opt->use_reserved_11;
        opt_g._0_8_ = auVar1._0_8_;
        opt_g.blob_allocator = inner_top_blob.allocator;
        opt_g.workspace_allocator = (Allocator *)auVar1._16_8_;
        opt_g.openmp_blocktime = auVar1._24_4_;
        opt_g.use_winograd_convolution = (bool)auVar1[0x1c];
        opt_g.use_sgemm_convolution = (bool)auVar1[0x1d];
        opt_g.use_int8_inference = (bool)auVar1[0x1e];
        opt_g.use_vulkan_compute = (bool)auVar1[0x1f];
        (*this->convolution_dilation1->_vptr_Layer[7])
                  (this->convolution_dilation1,&inner_bottom_blob,&inner_top_blob,&opt_g);
        for (iVar17 = 0;
            iVar17 < *(int *)(this->_vptr_Convolution_x86_avx2[-3] + 0x30 +
                             (long)&(this->weight_data_3x3_winograd63).data); iVar17 = iVar17 + 1) {
          Mat::channel(&local_c0,top_blob,iVar17);
          local_228 = (undefined4 *)((long)local_c0.data + local_1a8);
          Mat::~Mat(&local_c0);
          lVar25 = 0;
          for (lVar22 = 0; lVar22 <= iVar10; lVar22 = lVar22 + 1) {
            Mat::channel(&local_c0,&inner_top_blob,iVar17);
            pvVar23 = local_c0.data;
            Mat::~Mat(&local_c0);
            puVar24 = local_228;
            for (lVar12 = 0; lVar12 <= iVar19; lVar12 = lVar12 + 1) {
              *puVar24 = *(undefined4 *)((long)pvVar23 + lVar12 * 4 + lVar25);
              puVar24 = puVar24 + (int)uVar6;
            }
            lVar25 = lVar25 + (long)_w_00 * 4;
            local_228 = local_228 + (int)(_w * uVar6);
          }
        }
        local_1a0 = local_1a0 + 4;
        local_1a8 = local_1a8 + 4;
      }
      local_208 = local_208 + (long)iVar2 * 4;
      local_1d0 = local_1d0 + (long)iVar9 * 4 + 4;
    }
    pLVar8 = this->activation;
    iVar19 = 0;
    if (pLVar8 != (Layer *)0x0) {
      (*pLVar8->_vptr_Layer[9])(pLVar8,top_blob,opt);
    }
LAB_0018319f:
    Mat::~Mat(&inner_top_blob);
    Mat::~Mat(&inner_bottom_blob);
  }
  return iVar19;
}

Assistant:

int Convolution_x86_avx2::forwardDilation_x86(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    int w = bottom_blob.w;
    int h = bottom_blob.h;
    size_t elemsize = bottom_blob.elemsize;

    const int kernel_size = kernel_w;
    const int stride = stride_w;
    const int dilation = dilation_w;
    const int kernel_extent = dilation * (kernel_size - 1) + 1;

    int outw = (w - kernel_extent) / stride + 1;
    int outh = (h - kernel_extent) / stride + 1;

    top_blob.create(outw, outh, num_output, elemsize, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    // Make (dilation * dilation) batches
    Mat inner_bottom_blob;
    Mat inner_top_blob;
    for (int x = 0; x < dilation; x++)
    {
        for (int y = 0; y < dilation; y++)
        {
            int inner_w = (w - y + dilation - 1) / dilation;
            int inner_h = (h - x + dilation - 1) / dilation;

            int inner_outw = (inner_w - kernel_size) / stride + 1;
            int inner_outh = (inner_h - kernel_size) / stride + 1;

            inner_bottom_blob.create(inner_w, inner_h, bottom_blob.c, elemsize, opt.workspace_allocator);
            if (inner_bottom_blob.empty())
                return -100;

            inner_top_blob.create(inner_outw, inner_outh, num_output, elemsize, opt.workspace_allocator);
            if (inner_top_blob.empty())
                return -100;

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int c = 0; c < bottom_blob.c; c++)
            {
                float* outptr = inner_bottom_blob.channel(c);

                for (int i = 0; i < inner_h; i++)
                {
                    const float* ptr = (const float*)bottom_blob.channel(c) + dilation * i * w + x * w + y;
                    for (int j = 0; j < inner_w; j++)
                    {
                        outptr[j] = ptr[j * dilation];
                    }
                    outptr += inner_w;
                }
            }

            Option opt_g = opt;
            opt_g.blob_allocator = inner_top_blob.allocator;
            convolution_dilation1->forward(inner_bottom_blob, inner_top_blob, opt_g);

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int c = 0; c < num_output; c++)
            {
                float* outptr = (float*)top_blob.channel(c) + x * outw + y;
                for (int i = 0; i < inner_outh; i++)
                {
                    const float* ptr = (const float*)inner_top_blob.channel(c) + i * inner_outw;
                    for (int j = 0; j < inner_outw; j++)
                    {
                        outptr[j * dilation] = ptr[j];
                    }
                    outptr += dilation * outw;
                }
            }
        }
    }

    if (activation)
    {
        activation->forward_inplace(top_blob, opt);
    }

    return 0;
}